

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_put.c
# Opt level: O1

int buffer_put(buffer *s,char *buf,uint len)

{
  uint uVar1;
  int iVar2;
  uint len_00;
  
  uVar1 = s->n;
  if (uVar1 - s->p < len) {
    iVar2 = buffer_flush(s);
    if (iVar2 == -1) {
      return -1;
    }
    if (s->n < len) {
      len_00 = 0x2000;
      if (0x2000 < uVar1) {
        len_00 = uVar1;
      }
      do {
        if (len <= len_00) {
          len_00 = len;
        }
        iVar2 = allwrite(s->op,s->fd,buf,len_00);
        if (iVar2 == -1) {
          return -1;
        }
        buf = buf + len_00;
        len = len - len_00;
      } while (s->n < len);
    }
  }
  byte_copy(s->x + s->p,len,buf);
  s->p = s->p + len;
  return 0;
}

Assistant:

int buffer_put(buffer *s,const char *buf,unsigned int len)
{
  unsigned int n;
 
  n = s->n;
  if (len > n - s->p) {
    if (buffer_flush(s) == -1) return -1;
    /* now s->p == 0 */
    if (n < BUFFER_OUTSIZE) n = BUFFER_OUTSIZE;
    while (len > s->n) {
      if (n > len) n = len;
      if (allwrite(s->op,s->fd,buf,n) == -1) return -1;
      buf += n;
      len -= n;
    }
  }
  /* now len <= s->n - s->p */
  byte_copy(s->x + s->p,len,buf);
  s->p += len;
  return 0;
}